

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_base_boundary_constructors<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>>
               (void)

{
  uint uVar1;
  pointer ppVar2;
  bool bVar3;
  Column_dimension_option CVar4;
  _Rb_tree_node_base *p_Var5;
  uint uVar6;
  const_iterator __begin0;
  pointer ppVar7;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range4;
  const_iterator __end0;
  const_iterator __begin0_1;
  const_iterator __end0_1;
  Container cont2;
  size_t local_220;
  undefined4 *local_218;
  size_t *local_210;
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *local_208;
  ulong local_200;
  shared_count sStack_1f8;
  undefined4 **local_1f0;
  _Alloc_node local_1e8;
  undefined1 local_1e0;
  undefined8 *local_1d8;
  undefined ***local_1d0;
  Container cont1;
  undefined4 local_1ac;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  col;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  rowCol;
  Column_settings settings;
  undefined **local_e8;
  char *local_e0;
  shared_count sStack_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  shared_count sStack_b8;
  undefined4 **local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  cont1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cont1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cont1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cont2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cont2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cont2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  col.super_Column_dimension_option.dim_ = 0;
  col._4_4_ = 1;
  col.column_._M_t._M_impl._0_4_ = 2;
  col.column_._M_t._M_impl._4_4_ = 2;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 3;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&cont1,&col);
  col.super_Column_dimension_option.dim_ = 0;
  col._4_4_ = 1;
  col.column_._M_t._M_impl._0_4_ = 5;
  col.column_._M_t._M_impl._4_4_ = 2;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 3;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&cont2,&col);
  ppVar2 = cont1.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  col.super_Column_dimension_option.dim_ =
       (int)((ulong)((long)cont1.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)cont1.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  if (cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    col.super_Column_dimension_option.dim_ = 0;
  }
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &col.column_._M_t._M_impl.super__Rb_tree_header._M_header;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       col.column_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  col.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  col.operators_ = &settings.operators;
  if (cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVar7 = cont1.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar6 = ppVar7->second;
      if ((col.operators_)->characteristic_ <= uVar6) {
        uVar6 = uVar6 % (col.operators_)->characteristic_;
      }
      uVar1 = ppVar7->first;
      local_1e8._M_t =
           (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
            *)operator_new(8);
      *(uint *)&((local_1e8._M_t)->_M_impl).field_0x4 = uVar1;
      *(uint *)&(local_1e8._M_t)->_M_impl = uVar6;
      rowCol._0_8_ = &col.column_;
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>>
      ::
      _M_insert_unique_<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*const&,std::_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>>::_Alloc_node>
                ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>>
                  *)rowCol._0_8_,(const_iterator)&col.column_._M_t._M_impl.super__Rb_tree_header,
                 (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                  **)&local_1e8,(_Alloc_node *)&rowCol);
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar2);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x261);
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
               *)&PTR__lazy_ostream_001b87b0;
  sStack_1f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (undefined4 **)0x19328b;
  local_b0 = &local_218;
  local_218 = (undefined4 *)col.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_210 = &local_220;
  local_220 = CONCAT44(local_220._4_4_,3);
  local_e8 = (undefined **)
             CONCAT71(local_e8._1_7_,
                      col.column_._M_t._M_impl.super__Rb_tree_header._M_node_count == 3);
  local_e0 = (char *)0x0;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c0 = "";
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&local_b0;
  rowCol.column_._M_t._M_impl._0_1_ = 0;
  rowCol._0_8_ = &PTR__lazy_ostream_001b8720;
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &boost::unit_test::lazy_ostream::inst;
  local_1d0 = (undefined ***)&local_210;
  local_1e0 = 0;
  local_1e8._M_t =
       (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
        *)&PTR__lazy_ostream_001b8770;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  ppVar2 = cont2.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  CVar4.dim_ = (int)((ulong)((long)cont2.
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)cont2.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  if (cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    CVar4.dim_ = 0;
  }
  rowCol.super_Column_dimension_option.dim_ = CVar4.dim_;
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header;
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rowCol.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  rowCol.operators_ = &settings.operators;
  rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVar7 = cont2.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar6 = ppVar7->second;
      if ((rowCol.operators_)->characteristic_ <= uVar6) {
        uVar6 = uVar6 % (rowCol.operators_)->characteristic_;
      }
      uVar1 = ppVar7->first;
      local_208 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                   *)operator_new(8);
      local_208->rowIndex_ = uVar1;
      (local_208->super_Entry_field_element_option).element_ = uVar6;
      local_1e8._M_t = &rowCol.column_._M_t;
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>>
      ::
      _M_insert_unique_<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*const&,std::_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>>::_Alloc_node>
                ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>*>>
                  *)local_1e8._M_t,
                 (const_iterator)&rowCol.column_._M_t._M_impl.super__Rb_tree_header,&local_208,
                 &local_1e8);
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar2);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x265);
  local_e0 = (char *)((ulong)local_e0 & 0xffffffffffffff00);
  local_e8 = &PTR__lazy_ostream_001b87b0;
  sStack_d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_220 = rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_218 = &local_1ac;
  local_c8 = (char *)CONCAT71(local_c8._1_7_,
                              rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_node_count == 3);
  local_1ac = 3;
  local_c0 = (char *)0x0;
  sStack_b8.pi_ = (sp_counted_base *)0x0;
  local_b0 = (undefined4 **)0x19330d;
  local_a8 = (_Base_ptr)0x193380;
  local_210 = &local_220;
  local_1e0 = 0;
  local_1e8._M_t =
       (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
        *)&PTR__lazy_ostream_001b8720;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = (undefined ***)&local_210;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
               *)&PTR__lazy_ostream_001b8770;
  sStack_1f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = &local_218;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_e8,&local_b0,0x265,1,2,2,"rowCol.size()",&local_1e8,"3",&local_208);
  boost::detail::shared_count::~shared_count(&sStack_b8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x267);
  bVar3 = Gudhi::persistence_matrix::operator==(&col,&rowCol);
  local_208 = (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
               *)CONCAT71(local_208._1_7_,!bVar3);
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_e8 = (undefined **)0x193b6f;
  local_e0 = "";
  local_1e0 = 0;
  local_1e8._M_t =
       (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
        *)&PTR__lazy_ostream_001b87f0;
  local_1d8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = (_Base_ptr)0x19330d;
  local_98 = (_Base_ptr)0x193380;
  local_1d0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  for (p_Var5 = rowCol.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &rowCol.column_._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    operator_delete(*(void **)(p_Var5 + 1),8);
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
  ::~_Rb_tree(&rowCol.column_._M_t);
  for (p_Var5 = col.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &col.column_._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    operator_delete(*(void **)(p_Var5 + 1),8);
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
  ::~_Rb_tree(&col.column_._M_t);
  if (cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cont2.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cont2.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cont2.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cont1.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cont1.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cont1.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (settings.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(settings.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

std::vector<Column> build_base_boundary_column_matrix(Rows& rows, typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;
    matrix.emplace_back(0, cont{0, 1, 3, 5}, &rows, &settings);
    matrix.emplace_back(1, cont{0, 1, 2, 5, 6}, &rows, &settings);
    matrix.emplace_back(2, cont{0, 1, 2, 5, 6}, &rows, &settings);
    matrix.emplace_back(3, cont{}, &rows, &settings);
    matrix.emplace_back(4, cont{0, 1, 3, 5}, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(0, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &rows, &settings);
    matrix.emplace_back(1, cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &rows, &settings);
    matrix.emplace_back(2, cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &rows, &settings);
    matrix.emplace_back(3, cont{}, &rows, &settings);
    matrix.emplace_back(4, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  }

  return matrix;
}